

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.c
# Opt level: O0

void parse_arguments(Arguments *arguments,int argc,char **argv)

{
  int iVar1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  int *in_RDI;
  int option;
  int long_index;
  undefined4 local_1c;
  undefined8 local_18;
  undefined4 local_c;
  int *local_8;
  
  local_1c = 0;
  _optind = 0;
  *in_RDI = 0x1000;
  in_RDI[1] = 1000;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  while (iVar1 = getopt_long(local_c,local_18,"+:s:c:",parse_arguments::long_options,&local_1c),
        iVar1 != -1) {
    if (iVar1 == 99) {
      iVar1 = atoi(_optarg);
      local_8[1] = iVar1;
    }
    else if (iVar1 == 0x73) {
      iVar1 = atoi(_optarg);
      *local_8 = iVar1;
    }
  }
  return;
}

Assistant:

void parse_arguments(Arguments *arguments, int argc, char *argv[]) {
	// For getopt long options
	int long_index = 0;
	// For getopt chars
	int option;

	// Reset the option index to 1 if it
	// was modified before (e.g. in check_flag)
	optind = 0;

	// Default values
	arguments->size = DEFAULT_MESSAGE_SIZE;
	arguments->count = 1000;

	// Command line arguments
	// clang-format off
	static struct option long_options[] = {
			{"size",  required_argument, NULL, 's'},
			{"count", required_argument, NULL, 'c'},
			{0,       0,                 0,     0}
	};
	// clang-format on

	while (true) {
		option = getopt_long(argc, argv, "+:s:c:", long_options, &long_index);

		switch (option) {
			case -1: return;
			case 's': arguments->size = atoi(optarg); break;
			case 'c': arguments->count = atoi(optarg); break;
			default: continue;
		}
	}
}